

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O1

void __thiscall ProfileHandler::RegisterThread(ProfileHandler *this)

{
  pthread_key_t __key;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 *__pointer;
  bool bVar7;
  sigval_t sStack_a8;
  sigevent sevp;
  itimerspec local_60;
  timer_t local_40;
  timer_t timerid;
  SpinLockHolder cl;
  
  timerid = &this->control_lock_;
  LOCK();
  bVar7 = (this->control_lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar7) {
    (this->control_lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar7) {
    SpinLock::SlowLock((SpinLock *)timerid);
  }
  if (this->allowed_ == true) {
    if (this->per_thread_timer_enabled_ == true) {
      iVar3 = this->frequency_;
      iVar2 = this->signal_number_;
      __key = this->thread_timer_key;
      iVar1 = this->timer_type_;
      sStack_a8.sival_ptr = (void *)0x0;
      sevp.sigev_signo = 0;
      sevp.sigev_notify = 0;
      sevp._sigev_un._sigev_thread._function = (_func_void___sigval_t *)0x0;
      sevp._sigev_un._sigev_thread._attribute = (pthread_attr_t *)0x0;
      sevp._sigev_un._16_8_ = 0;
      sevp._sigev_un._24_8_ = 0;
      sevp._sigev_un._32_8_ = 0;
      sevp.sigev_value = (__sigval_t)0x400000000;
      lVar4 = syscall(0xba);
      sevp.sigev_signo = (int)lVar4;
      sevp.sigev_value.sival_int = iVar2;
      iVar2 = timer_create((uint)(iVar1 != 0) * 2 + 1,(sigevent *)&sStack_a8,&local_40);
      if (iVar2 != 0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        RAW_LOG(-4,"aborting due to timer_create error: %s",pcVar6);
      }
      __pointer = (undefined8 *)operator_new(8);
      *__pointer = local_40;
      iVar2 = pthread_setspecific(__key,__pointer);
      if (iVar2 != 0) {
        pcVar6 = strerror(iVar2);
        RAW_LOG(-4,"aborting due to tcmalloc::SetTlsValue error: %s",pcVar6);
      }
      local_60.it_interval.tv_sec = 0;
      local_60.it_interval.tv_nsec = (long)(int)(1000000000 / (long)iVar3);
      local_60.it_value.tv_sec = 0;
      local_60.it_value.tv_nsec = local_60.it_interval.tv_nsec;
      iVar3 = timer_settime(local_40,0,&local_60,(itimerspec *)0x0);
      if (iVar3 != 0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        RAW_LOG(-4,"aborting due to timer_settime error: %s",pcVar6);
      }
    }
    else {
      UpdateTimer(this,0 < this->callback_count_);
    }
  }
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&timerid);
  return;
}

Assistant:

void ProfileHandler::RegisterThread() {
  SpinLockHolder cl(&control_lock_);

  if (!allowed_) {
    return;
  }

  // Record the thread identifier and start the timer if profiling is on.
#if HAVE_LINUX_SIGEV_THREAD_ID
  if (per_thread_timer_enabled_) {
    StartLinuxThreadTimer(timer_type_, signal_number_, frequency_,
                          thread_timer_key);
    return;
  }
#endif
  UpdateTimer(callback_count_ > 0);
}